

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O0

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n)

{
  void *pvVar1;
  void *__ptr;
  void *pvVar2;
  char *cd;
  uint local_28;
  uint c;
  int p;
  int start;
  int i;
  int n_local;
  HuffmanCode *huffmanCode_local;
  HuffmanTree *huffmanTree_local;
  
  pvVar1 = malloc((long)(n + 1) << 3);
  __ptr = malloc((long)n);
  *(undefined1 *)((long)__ptr + (long)(n + -1)) = 0;
  for (p = 1; p <= n; p = p + 1) {
    c = n - 1;
    cd._4_4_ = p;
    for (local_28 = (*huffmanTree)[p].parent; local_28 != 0;
        local_28 = huffmanTree[(int)local_28]->parent) {
      if ((*huffmanTree)[(int)local_28].lchild == cd._4_4_) {
        *(undefined1 *)((long)__ptr + (long)(int)(c - 1)) = 0x30;
      }
      else {
        *(undefined1 *)((long)__ptr + (long)(int)(c - 1)) = 0x31;
      }
      c = c - 1;
      cd._4_4_ = local_28;
    }
    pvVar2 = malloc((long)(int)(n - c));
    *(void **)((long)pvVar1 + (long)p * 8) = pvVar2;
    strcpy(*(char **)((long)pvVar1 + (long)p * 8),(char *)((long)__ptr + (long)(int)c));
  }
  free(__ptr);
  for (p = 1; p <= n; p = p + 1) {
    printf("Huffmancode of %3d is %s\n",(ulong)(*huffmanTree)[p].weight,
           *(undefined8 *)((long)pvVar1 + (long)p * 8));
  }
  printf("\n");
  return;
}

Assistant:

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n){
    //指示标记
    int i;
    //编码的起始指针
    int start;
    //编码的起始的父节点
    int p;
    //遍历n个叶子结点的指示标记c
    unsigned int c;
    //分配n个编码的头指针
    huffmanCode = (HuffmanCode *)malloc((n + 1) * sizeof(char *));
    //分配求当前编码的工作空间
    char *cd = (char *)malloc(n * sizeof(char));
    //从右向左逐位存放编码，首先存放编码结束符
    cd[n - 1] = '\0';
    //求n个叶子结点对应的哈夫曼编码
    for (i = 1;i <= n;i++){
        //初始化编码起始指针
        start = n - 1;
        //从叶子到根结点求编码
        for (c = i,p =  (*huffmanTree)[i].parent;p != 0; c = p, p = (*huffmanTree[p]).parent) {
            if ((*huffmanTree)[p].lchild == c) {
                //从右到左的顺序编码入数组内
                cd[--start] = '0';  //左分支标0
            } else {
                cd[--start] = '1';  //右分支标1
            }

        }//为第i个编码分配空间
            huffmanCode[i] = (char *)malloc((n - start) * sizeof(char));

            strcpy(huffmanCode[i],&cd[start]);
    }

        free(cd);
        //打印编码序列
        for(i = 1;i <= n;i++){
            printf("Huffmancode of %3d is %s\n",(*huffmanTree)[i].weight,huffmanCode[i]);
        }

    printf("\n");
}